

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_finish_key_creation(psa_key_slot_t *slot,psa_se_drv_table_entry_t *driver)

{
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  size_t local_40;
  size_t length;
  uint8_t *buffer;
  size_t buffer_size;
  psa_se_drv_table_entry_t *ppStack_20;
  psa_status_t status;
  psa_se_drv_table_entry_t *driver_local;
  psa_key_slot_t *slot_local;
  
  buffer_size._4_4_ = 0;
  if ((slot->attr).lifetime != 0) {
    if ((((slot->attr).type & 0x7000) == 0x1000) || (((slot->attr).type & 0x7000) == 0x2000)) {
      local_44 = ((slot->attr).bits + 7) / 8;
    }
    else {
      if ((slot->attr).type == 0x7001) {
        local_48 = (((slot->attr).bits / 2 + 1) / 8 + 5) * 9 + 0xe;
      }
      else {
        if ((slot->attr).type == 0x4001) {
          local_4c = (slot->attr).bits / 8 + 0x10;
        }
        else {
          if ((slot->attr).type == 0x7002) {
            local_50 = ((slot->attr).bits / 8 + 5) * 3 + 0x4b;
          }
          else {
            if ((slot->attr).type == 0x4002) {
              local_54 = ((slot->attr).bits / 8 + 5) * 3 + 0x3b;
            }
            else {
              if (((slot->attr).type & 0xff00) == 0x7100) {
                local_58 = ((slot->attr).bits + 7) / 8;
              }
              else {
                if (((slot->attr).type & 0xff00) == 0x4100) {
                  local_5c = (((slot->attr).bits + 7) / 8) * 2 + 1;
                }
                else {
                  local_5c = 0;
                }
                local_58 = local_5c;
              }
              local_54 = local_58;
            }
            local_50 = local_54;
          }
          local_4c = local_50;
        }
        local_48 = local_4c;
      }
      local_44 = local_48;
    }
    buffer = (uint8_t *)(long)(int)local_44;
    ppStack_20 = driver;
    driver_local = (psa_se_drv_table_entry_t *)slot;
    length = (size_t)calloc(1,(size_t)buffer);
    local_40 = 0;
    if ((uint8_t *)length == (uint8_t *)0x0) {
      return -0x8d;
    }
    buffer_size._4_4_ =
         psa_internal_export_key
                   ((psa_key_slot_t *)driver_local,(uint8_t *)length,(size_t)buffer,&local_40,0);
    if (buffer_size._4_4_ == 0) {
      buffer_size._4_4_ =
           psa_save_persistent_key
                     ((psa_core_key_attributes_t *)driver_local,(uint8_t *)length,local_40);
    }
    mbedtls_platform_zeroize((void *)length,(size_t)buffer);
    free((void *)length);
  }
  return buffer_size._4_4_;
}

Assistant:

static psa_status_t psa_finish_key_creation(
    psa_key_slot_t *slot,
    psa_se_drv_table_entry_t *driver )
{
    psa_status_t status = PSA_SUCCESS;
    (void) slot;
    (void) driver;

#if defined(MBEDTLS_PSA_CRYPTO_STORAGE_C)
    if( slot->attr.lifetime != PSA_KEY_LIFETIME_VOLATILE )
    {
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
        if( driver != NULL )
        {
            psa_se_key_data_storage_t data;
#if defined(static_assert)
            static_assert( sizeof( slot->data.se.slot_number ) ==
                           sizeof( data.slot_number ),
                           "Slot number size does not match psa_se_key_data_storage_t" );
            static_assert( sizeof( slot->attr.bits ) == sizeof( data.bits ),
                           "Bit-size size does not match psa_se_key_data_storage_t" );
#endif
            memcpy( &data.slot_number, &slot->data.se.slot_number,
                    sizeof( slot->data.se.slot_number ) );
            memcpy( &data.bits, &slot->attr.bits,
                    sizeof( slot->attr.bits ) );
            status = psa_save_persistent_key( &slot->attr,
                                              (uint8_t*) &data,
                                              sizeof( data ) );
        }
        else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
        {
            size_t buffer_size =
                PSA_KEY_EXPORT_MAX_SIZE( slot->attr.type,
                                         slot->attr.bits );
            uint8_t *buffer = mbedtls_calloc( 1, buffer_size );
            size_t length = 0;
            if( buffer == NULL )
                return( PSA_ERROR_INSUFFICIENT_MEMORY );
            status = psa_internal_export_key( slot,
                                              buffer, buffer_size, &length,
                                              0 );
            if( status == PSA_SUCCESS )
                status = psa_save_persistent_key( &slot->attr,
                                                  buffer, length );

            mbedtls_platform_zeroize( buffer, buffer_size );
            mbedtls_free( buffer );
        }
    }
#endif /* defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    /* Finish the transaction for a key creation. This does not
     * happen when registering an existing key. Detect this case
     * by checking whether a transaction is in progress (actual
     * creation of a key in a secure element requires a transaction,
     * but registration doesn't use one). */
    if( driver != NULL &&
        psa_crypto_transaction.unknown.type == PSA_CRYPTO_TRANSACTION_CREATE_KEY )
    {
        status = psa_save_se_persistent_data( driver );
        if( status != PSA_SUCCESS )
        {
            psa_destroy_persistent_key( slot->attr.id );
            return( status );
        }
        status = psa_crypto_stop_transaction( );
        if( status != PSA_SUCCESS )
            return( status );
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    return( status );
}